

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tools_class.cpp
# Opt level: O2

void __thiscall test_tools::test_key_value_pair::test_method(test_key_value_pair *this)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_f9;
  undefined1 local_f8 [8];
  undefined1 local_f0 [16];
  undefined1 *local_e0;
  undefined8 local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  allocator<char> local_90 [32];
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"driver",local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"QIBASE",&local_f9);
  tools::make_key_value_pair<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  this_00 = (string *)local_f0;
  std::__cxx11::string::~string(this_00);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_40,0x46,&local_50);
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_00176b40;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = (long)"\t" + 1;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_98 = "";
  tools::connection_option::key<std::__cxx11::string,std::__cxx11::string>
            (&local_d0,(connection_option *)local_f8);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (local_f0,&local_a0,0x46,1,2,&local_d0,"(p->key<std::string, std::string>())","driver",
             "\"driver\"");
  this_01 = &local_d0;
  std::__cxx11::string::~string((string *)this_01);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_60.m_end = "";
  local_70.m_begin = "";
  local_70.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_01,&local_60,0x47,&local_70);
  local_f0[8] = '\0';
  local_f0._0_8_ = &PTR__lazy_ostream_00176b40;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = (long)"\t" + 1;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
  ;
  local_a8 = "";
  tools::connection_option::value<std::__cxx11::string,std::__cxx11::string>
            (&local_d0,(connection_option *)local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"QIBASE",&local_f9);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_f0,&local_b0,0x47,1,2,&local_d0,"(p->value<std::string, std::string>())",
             (string *)local_90,"std::string(\"QIBASE\")");
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  if (local_f8 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_f8)[1])();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_key_value_pair)
{
    auto p{tools::make_key_value_pair(std::string("driver"), std::string("QIBASE"))};
    BOOST_CHECK_EQUAL((p->key<std::string, std::string>()), "driver");
    BOOST_CHECK_EQUAL((p->value<std::string, std::string>()), std::string("QIBASE"));
}